

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable_locks.c
# Opt level: O0

void lock_test1(void)

{
  uint32_t asn;
  pthread_t pVar1;
  long lVar2;
  unsigned_long uVar3;
  uint ASN;
  _Bool _Var4;
  spki_record *psVar5;
  long lVar6;
  undefined1 *__arg;
  void *__arg_00;
  ulong uVar7;
  pthread_t *ppVar8;
  long in_FS_OFFSET;
  undefined8 uStack_340;
  undefined1 auStack_338 [320];
  undefined1 auStack_1f8 [8];
  long local_1f0;
  undefined1 *local_1e8;
  long local_1e0;
  uint local_1d8;
  uint local_1d4;
  uint i_4;
  uint i_3;
  unsigned_long __vla_expr2;
  spki_record *record;
  uint local_1b8;
  uint i_2;
  uint i_1;
  uint i;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_194;
  uint local_190;
  uint records_per_thread;
  uint max_threads;
  uint result_size;
  spki_record *result;
  spki_table spkit;
  
  __vla_expr0 = (unsigned_long)auStack_1f8;
  spkit.lock._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_190 = 0x14;
  local_194 = 10000;
  __vla_expr1 = 0x14;
  uStack_340 = 0x1022da;
  local_1e8 = auStack_338;
  spki_table_init((spki_table *)&result,(spki_update_fp)0x0);
  _i_1 = (ulong)local_190;
  lVar2 = -(_i_1 * 8 + 0xf & 0xfffffffffffffff0);
  lVar6 = (long)auStack_338 + lVar2;
  local_1e0 = lVar6;
  for (i_2 = 0; i_2 < local_190; i_2 = i_2 + 1) {
    *(spki_record ***)(local_1e8 + (ulong)i_2 * 0x10) = &result;
    *(uint *)(local_1e8 + (ulong)i_2 * 0x10 + 8) = i_2 * local_194;
    *(int *)(local_1e8 + (ulong)i_2 * 0x10 + 0xc) = local_194;
    ppVar8 = (pthread_t *)(local_1e0 + (ulong)i_2 * 8);
    __arg = local_1e8 + (ulong)i_2 * 0x10;
    *(undefined8 *)(auStack_338 + lVar2 + -8) = 0x1023b0;
    pthread_create(ppVar8,(pthread_attr_t *)0x0,add_records,__arg);
  }
  for (local_1b8 = 0; local_1b8 < local_190; local_1b8 = local_1b8 + 1) {
    pVar1 = *(pthread_t *)(local_1e0 + (ulong)local_1b8 * 8);
    *(undefined8 *)(auStack_338 + lVar2 + -8) = 0x1023f6;
    pthread_join(pVar1,(void **)0x0);
    uVar7 = (ulong)local_1b8;
    *(undefined8 *)(auStack_338 + lVar2 + -8) = 0x10240a;
    printf("Thread %i returned\n",uVar7);
  }
  records_per_thread = 0;
  record._4_4_ = 0;
  while( true ) {
    ASN = record._4_4_;
    if (local_194 * local_190 <= record._4_4_) {
      _i_4 = (ulong)local_190;
      lVar6 = lVar6 + _i_4 * -0x10;
      local_1f0 = lVar6;
      for (local_1d4 = 0; local_1d4 < local_190; local_1d4 = local_1d4 + 1) {
        *(spki_record ***)(local_1f0 + (ulong)local_1d4 * 0x10) = &result;
        *(uint *)(local_1f0 + (ulong)local_1d4 * 0x10 + 8) = local_1d4 * local_194;
        *(int *)(local_1f0 + (ulong)local_1d4 * 0x10 + 0xc) = local_194;
        ppVar8 = (pthread_t *)(local_1e0 + (ulong)local_1d4 * 8);
        __arg_00 = (void *)(local_1f0 + (ulong)local_1d4 * 0x10);
        *(undefined8 *)(lVar6 + -8) = 0x1025f8;
        pthread_create(ppVar8,(pthread_attr_t *)0x0,remove_records,__arg_00);
      }
      for (local_1d8 = 0; local_1d8 < local_190; local_1d8 = local_1d8 + 1) {
        pVar1 = *(pthread_t *)(local_1e0 + (ulong)local_1d8 * 8);
        *(undefined8 *)(lVar6 + -8) = 0x10263e;
        pthread_join(pVar1,(void **)0x0);
        uVar7 = (ulong)local_1d8;
        *(undefined8 *)(lVar6 + -8) = 0x102652;
        printf("Thread %i returned\n",uVar7);
      }
      *(undefined8 *)(lVar6 + -8) = 0x10266f;
      spki_table_free((spki_table *)&result);
      *(undefined8 *)(lVar6 + -8) = 0x102684;
      printf("%s() complete\n","lock_test1");
      if (*(long *)(in_FS_OFFSET + 0x28) == spkit.lock._48_8_) {
        return;
      }
      *(undefined8 *)(__vla_expr0 - 8) = 0x1026aa;
      __stack_chk_fail();
    }
    *(undefined8 *)(auStack_338 + lVar2 + -8) = 0x102465;
    psVar5 = create_record(ASN,ASN,ASN,(rtr_socket *)0x0);
    asn = psVar5->asn;
    __vla_expr2 = (unsigned_long)psVar5;
    *(undefined8 *)(auStack_338 + lVar2 + -8) = 0x102497;
    spki_table_get_all((spki_table *)&result,asn,psVar5->ski,(spki_record **)&max_threads,
                       &records_per_thread);
    psVar5 = _max_threads;
    uVar3 = __vla_expr2;
    if (records_per_thread != 1) {
      *(undefined8 *)(auStack_338 + lVar2 + -8) = 0x1024c1;
      __assert_fail("result_size == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable_locks.c"
                    ,0x90,"void lock_test1(void)");
    }
    *(undefined8 *)(auStack_338 + lVar2 + -8) = 0x1024d4;
    _Var4 = compare_spki_records((spki_record *)uVar3,psVar5);
    psVar5 = _max_threads;
    if (!_Var4) break;
    *(undefined8 *)(auStack_338 + lVar2 + -8) = 0x102507;
    free(psVar5);
    uVar3 = __vla_expr2;
    *(undefined8 *)(auStack_338 + lVar2 + -8) = 0x102513;
    free((void *)uVar3);
    record._4_4_ = record._4_4_ + 1;
  }
  *(undefined8 *)(auStack_338 + lVar2 + -8) = 0x1024fb;
  __assert_fail("compare_spki_records(record, &result[0])",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable_locks.c"
                ,0x91,"void lock_test1(void)");
}

Assistant:

static void lock_test1(void)
{
	unsigned int max_threads = 20;
	unsigned int records_per_thread = 10000;
	struct spki_table spkit;
	struct add_records_args args[max_threads];

	spki_table_init(&spkit, NULL);
	pthread_t threads[max_threads];

	/* Concurrently add SPKI records to the table */
	for (unsigned int i = 0; i < max_threads; i++) {
		args[i].table = &spkit;
		args[i].start_asn = i * records_per_thread;
		args[i].count = records_per_thread;
		pthread_create(&threads[i], NULL, (void *(*)(void *))add_records, &args[i]);
	}

	/* Wait for parallel add operations to finish */
	for (unsigned int i = 0; i < max_threads; i++) {
		pthread_join(threads[i], NULL);
		printf("Thread %i returned\n", i);
	}

	/* Check all records for successful add */
	struct spki_record *result;
	unsigned int result_size = 0;

	for (unsigned int i = 0; i < records_per_thread * max_threads; i++) {
		struct spki_record *record = create_record(i, i, i, NULL);

		spki_table_get_all(&spkit, record->asn, record->ski, &result, &result_size);
		assert(result_size == 1);
		assert(compare_spki_records(record, &result[0]));
		free(result);
		free(record);
	}

	struct remove_records_args remove_args[max_threads];
	/* Concurrently delete SPKI records */
	for (unsigned int i = 0; i < max_threads; i++) {
		remove_args[i].table = &spkit;
		remove_args[i].start_asn = i * records_per_thread;
		remove_args[i].count = records_per_thread;
		pthread_create(&threads[i], NULL, (void *(*)(void *))remove_records, &remove_args[i]);
	}

	/* Wait for parallel delete operation to finish */
	for (unsigned int i = 0; i < max_threads; i++) {
		pthread_join(threads[i], NULL);
		printf("Thread %i returned\n", i);
	}

	/* cleanup: free spki_table */
	spki_table_free(&spkit);
	printf("%s() complete\n", __func__);
}